

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::OP_CommitScopeHelper
          (InterpreterStackFrame *this,PropertyIdArray *propIds)

{
  Var value;
  uint uVar1;
  ActivationObjectEx *this_00;
  ulong uVar2;
  
  this_00 = VarTo<Js::ActivationObjectEx>(*(Var *)(this + 0x58));
  if ((((this_00->parentFunc).ptr)->cachedScopeObj).ptr == this_00) {
    uVar1 = ActivationObjectEx::GetFirstVarSlot(propIds);
    value = *(Var *)(*(long *)(*(long *)(this + 0x78) + 8) + 0x430);
    for (uVar2 = (ulong)uVar1; uVar2 < propIds->count; uVar2 = uVar2 + 1) {
      DynamicObject::SetSlot
                ((DynamicObject *)this_00,(&propIds[1].count)[uVar2],false,(int)uVar2,value);
    }
    this_00->committed = true;
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_CommitScopeHelper(const PropertyIdArray *propIds)
    {
        ActivationObjectEx *obj = VarTo<ActivationObjectEx>(this->localClosure);
        ScriptFunction *func = obj->GetParentFunc();

        Assert(obj->GetParentFunc() == func);
        if (func->GetCachedScope() == obj)
        {
            PropertyId firstVarSlot = ActivationObjectEx::GetFirstVarSlot(propIds);

            Var undef = scriptContext->GetLibrary()->GetUndefined();

            for (uint i = firstVarSlot; i < propIds->count; i++)
            {
                obj->SetSlot(SetSlotArguments(propIds->elements[i], i, undef));
            }

            obj->SetCommit(true);
        }
    }